

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderedStorage.hpp
# Opt level: O0

void __thiscall
supermap::OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
::OrderedStorage(OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
                 *this,InnerRegisterSupplier *registerSupplier)

{
  undefined8 *in_RDI;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_()>
  *in_stack_ffffffffffffffa8;
  InnerRegisterSupplier *in_stack_ffffffffffffffc8;
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
  *in_stack_ffffffffffffffd0;
  
  *in_RDI = &PTR___cxa_pure_virtual_0038d408;
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_()>
  ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_()>
              *)(in_RDI + 1),in_stack_ffffffffffffffa8);
  CountingStorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_void>
  ::CountingStorageItemRegister(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_void>_>_>_()>
               *)0x1e9ce0);
  return;
}

Assistant:

explicit OrderedStorage(typename CountingRegister::InnerRegisterSupplier registerSupplier)
        : register_(std::move(registerSupplier)) {}